

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

int Abc_NtkRecTruthCompare(int *p1,int *p2)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Vec_Mem_t *pVVar5;
  int iVar6;
  
  uVar2 = *p1;
  if (-1 < (long)(int)uVar2) {
    iVar6 = s_pMan3->vSupps->nSize;
    if ((int)uVar2 < iVar6) {
      uVar3 = *p2;
      if ((-1 < (long)(int)uVar3) && ((int)uVar3 < iVar6)) {
        pcVar4 = s_pMan3->vSupps->pArray;
        iVar6 = (int)pcVar4[(int)uVar2] - (int)pcVar4[(int)uVar3];
        if (iVar6 != 0) {
          return iVar6;
        }
        pVVar5 = s_pMan3->vTtMem;
        if (((int)uVar2 < pVVar5->nEntries) && ((int)uVar3 < pVVar5->nEntries)) {
          bVar1 = (byte)pVVar5->LogPageSze;
          iVar6 = memcmp(pVVar5->ppPages[uVar2 >> (bVar1 & 0x1f)] +
                         (int)((uVar2 & pVVar5->PageMask) * pVVar5->nEntrySize),
                         pVVar5->ppPages[uVar3 >> (bVar1 & 0x1f)] +
                         (int)((pVVar5->PageMask & uVar3) * pVVar5->nEntrySize),
                         (long)s_pMan3->nWords << 3);
          return iVar6;
        }
        __assert_fail("i >= 0 && i < p->nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

int Abc_NtkRecTruthCompare( int * p1, int * p2 ) 
{
    int Diff = Vec_StrEntry( s_pMan3->vSupps, *p1 ) - Vec_StrEntry( s_pMan3->vSupps, *p2 );
    if ( Diff )
        return Diff;
    return memcmp( Vec_MemReadEntry(s_pMan3->vTtMem, *p1), Vec_MemReadEntry(s_pMan3->vTtMem, *p2), sizeof(word) * s_pMan3->nWords ); 
}